

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLog.cpp
# Opt level: O0

ssize_t __thiscall SocketLog::send(SocketLog *this,int __fd,void *__buf,size_t __n,int __flags)

{
  TCPStream *pTVar1;
  bool bVar2;
  int __fd_00;
  void *__buf_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  __normal_iterator<TCPStream_**,_std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>_> local_68;
  TCPStream **local_60;
  ssize_t local_58;
  ssize_t ret;
  TCPStream **stream;
  __normal_iterator<TCPStream_*const_*,_std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>_>
  local_40;
  const_iterator iter;
  size_type size;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lockStream;
  string *msg_local;
  SocketLog *this_local;
  
  lockStream._M_device = (mutex_type *)CONCAT44(in_register_00000034,__fd);
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->streamMutex);
  bVar2 = std::function::operator_cast_to_bool((function *)&this->sendInterceptor);
  if (((!bVar2) ||
      (bVar2 = std::
               function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               ::operator()(&this->sendInterceptor,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            lockStream._M_device), !bVar2)) && ((this->inited & 1U) != 0)) {
    iter._M_current =
         (TCPStream **)
         std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>::size(&this->connectedStreams);
    local_40._M_current =
         (TCPStream **)
         std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>::cbegin(&this->connectedStreams);
    while( true ) {
      stream = (TCPStream **)
               std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>::cend(&this->connectedStreams)
      ;
      bVar2 = __gnu_cxx::operator!=
                        (&local_40,
                         (__normal_iterator<TCPStream_*const_*,_std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>_>
                          *)&stream);
      if (!bVar2) break;
      ret = (ssize_t)__gnu_cxx::
                     __normal_iterator<TCPStream_*const_*,_std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>_>
                     ::operator*(&local_40);
      pTVar1 = *(TCPStream **)ret;
      __fd_00 = std::__cxx11::string::data();
      __buf_00 = (void *)std::__cxx11::string::length();
      local_58 = TCPStream::send(pTVar1,__fd_00,__buf_00,__n,__flags);
      if (local_58 == -1) {
        printf("send failed! delete(close) stream");
        printf("\n");
        pTVar1 = *(TCPStream **)ret;
        if (pTVar1 != (TCPStream *)0x0) {
          TCPStream::~TCPStream(pTVar1);
          operator_delete(pTVar1);
        }
        local_68._M_current =
             (TCPStream **)
             std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>::erase
                       (&this->connectedStreams,local_40._M_current);
        __gnu_cxx::
        __normal_iterator<TCPStream*const*,std::vector<TCPStream*,std::allocator<TCPStream*>>>::
        __normal_iterator<TCPStream**>
                  ((__normal_iterator<TCPStream*const*,std::vector<TCPStream*,std::allocator<TCPStream*>>>
                    *)&local_60,&local_68);
        local_40._M_current = local_60;
      }
      else {
        __gnu_cxx::
        __normal_iterator<TCPStream_*const_*,_std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>_>
        ::operator++(&local_40,0);
      }
    }
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return extraout_RAX;
}

Assistant:

void SocketLog::send(const std::string& msg) {
    std::lock_guard<std::mutex> lockStream(streamMutex);
    LOGD("SocketLog::send: %s", msg.c_str());

    if (sendInterceptor) {
        if (sendInterceptor(msg)) return;
    }

    if (!inited)
        return;

    auto size = connectedStreams.size();
    if (size == 0) {
        LOGD("no stream connected now! will not send!");
    } else {
        LOGD("stream connected num=%ld", size);
    }

    for(auto iter = connectedStreams.cbegin(); iter != connectedStreams.cend();) {
        auto& stream = *iter;

        LOGD("try to send to stream:%p", stream);
        auto ret = stream->send(msg.data(), msg.length());
        if (ret == -1) {
            LOGE("send failed! delete(close) stream");
            delete stream;
            iter = connectedStreams.erase(iter);
        } else {
            LOGD("send success!");
            iter++;
        }
    }
}